

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O0

void __thiscall
xemmai::t_type_of<xemmai::t_type_of<xemmai::t_object>>::t_type_of<2ul>
          (t_type_of<xemmai::t_type_of<xemmai::t_object>> *this,array<const_void_*,_2UL> *a_ids,
          t_type *a_super)

{
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  local_88;
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  local_58;
  int local_34;
  unsigned_long local_30;
  void *local_28;
  t_type *local_20;
  t_type *a_super_local;
  array<const_void_*,_2UL> *a_ids_local;
  t_type_of<xemmai::t_type_of<xemmai::t_object>_> *this_local;
  
  local_28 = (void *)0x0;
  local_30 = 0x178;
  local_34 = 0;
  local_58.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = a_super;
  a_super_local = (t_type *)a_ids;
  a_ids_local = (array<const_void_*,_2UL> *)this;
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::vector(&local_58);
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_88._M_t._M_impl._0_8_ = 0;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::map(&local_88);
  t_uninstantiatable<xemmai::t_bears<xemmai::t_type_of<xemmai::t_object>,xemmai::t_type_of<xemmai::t_object>>>
  ::
  t_derives<std::array<void_const*,2ul>const&,xemmai::t_type_of<xemmai::t_object>*&,decltype(nullptr),unsigned_long,int,std::vector<std::pair<xemmai::t_root,xemmai::t_value<std::vector>>,std::allocator<xemmai::t_value>>,std::map<xemmai::t_object*,unsigned_long,std::less<std::vector<std::pair<xemmai::t_root,xemmai::t_value<std::vector>>,std::allocator<xemmai::t_value>>>,std::allocator<xemmai::t_type_of<xemmai::t_object>*&<std::vector<std::pair<xemmai::t_root,xemmai::t_value<std::vector>>,std::allocator<xemmai::t_value>>const,unsigned_long>>>>
            ((t_uninstantiatable<xemmai::t_bears<xemmai::t_type_of<xemmai::t_object>,xemmai::t_type_of<xemmai::t_object>>>
              *)this,a_ids,&local_20,&local_28,&local_30,&local_34,&local_58,&local_88);
  std::
  map<xemmai::t_object_*,_unsigned_long,_std::less<xemmai::t_object_*>,_std::allocator<std::pair<xemmai::t_object_*const,_unsigned_long>_>_>
  ::~map(&local_88);
  std::
  vector<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>,_std::allocator<std::pair<xemmai::t_root,_xemmai::t_value<xemmai::t_root>_>_>_>
  ::~vector(&local_58);
  *(code **)(this + 0x68) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_scan;
  *(code **)(this + 0x90) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_do_get;
  *(undefined8 *)(this + 0x98) = 0;
  *(code **)(this + 200) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported0;
  *(code **)(this + 0xc0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported0;
  *(code **)(this + 0x170) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x168) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x160) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x158) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x150) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x148) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x140) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x138) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x130) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x128) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x120) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x118) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x108) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0x100) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xf8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xf0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xe8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xe0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xd8) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  *(code **)(this + 0xd0) = t_type_of<xemmai::t_type_of<xemmai::t_object>_>::f_not_supported1;
  return;
}

Assistant:

t_type_of(const std::array<t_type_id, A_n>& a_ids, t_type* a_super) : t_base(a_ids, a_super, nullptr, sizeof(t_type), 0, std::vector<std::pair<t_root, t_rvalue>>{}, std::map<t_object*, size_t>{})
	{
		f_finalize = f_do_scan;
		v_get = static_cast<t_pvalue (t_type::*)(t_object*, t_object*, size_t&)>(&t_type_of::f_do_get);
		f_string = f_hash = f_not_supported0;
		f_get_at = f_set_at = f_plus = f_minus = f_complement = f_multiply = f_divide = f_modulus = f_subtract = f_left_shift = f_right_shift = f_less = f_less_equal = f_greater = f_greater_equal = f_equals = f_not_equals = f_and = f_xor = f_or = f_not_supported1;
	}